

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void cuddRehash(DdManager *unique,int i)

{
  DdNode **ppDVar1;
  DdNode *pDVar2;
  _func_void_long *p_Var3;
  int iVar4;
  uint uVar5;
  DdNode **ppDVar6;
  DdNode **local_78;
  DdNodePtr *oddP;
  DdNodePtr *evenP;
  DD_OOMFP saveHandler;
  hack split;
  DdNode *sentinel;
  DdNode *next;
  DdNode *node;
  DdNodePtr *oldnodelist;
  DdNodePtr *nodelist;
  uint local_28;
  int pos;
  int j;
  int oldshift;
  int shift;
  uint oldslots;
  uint slots;
  int i_local;
  DdManager *unique_local;
  
  if (((unique->gcFrac == 4.0) && (!NAN(unique->gcFrac))) && (unique->looseUpTo < unique->slots)) {
    unique->gcFrac = 1.0;
    unique->minDead = unique->slots;
  }
  if (((unique->gcFrac != 0.2) || (NAN(unique->gcFrac))) && (unique->maxmem < unique->memused)) {
    unique->gcFrac = 0.2;
    unique->minDead = (uint)(long)((double)unique->slots * 0.2);
    cuddShrinkDeathRow(unique);
    iVar4 = cuddGarbageCollect(unique,1);
    if (0 < iVar4) {
      return;
    }
  }
  p_Var3 = Extra_UtilMMoutOfMemory;
  if (i == 0x7fffffff) {
    oldshift = (unique->constants).slots;
    ppDVar1 = (unique->constants).nodelist;
    shift = oldshift << 1;
    iVar4 = (unique->constants).shift + -1;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar6 = (DdNode **)malloc((ulong)(uint)shift << 3);
    if (ppDVar6 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var3;
      fprintf((FILE *)unique->err,"Unable to resize constant subtable for lack of memory\n");
      cuddGarbageCollect(unique,1);
      for (local_28 = 0; (int)local_28 < unique->size; local_28 = local_28 + 1) {
        unique->subtables[(int)local_28].maxKeys = unique->subtables[(int)local_28].maxKeys << 1;
      }
      (unique->constants).maxKeys = (unique->constants).maxKeys << 1;
      return;
    }
    Extra_UtilMMoutOfMemory = p_Var3;
    (unique->constants).slots = shift;
    (unique->constants).shift = iVar4;
    (unique->constants).maxKeys = oldshift << 3;
    (unique->constants).nodelist = ppDVar6;
    for (local_28 = 0; local_28 < (uint)shift; local_28 = local_28 + 1) {
      ppDVar6[(int)local_28] = (DdNode *)0x0;
    }
    for (local_28 = 0; local_28 < (uint)oldshift; local_28 = local_28 + 1) {
      next = ppDVar1[(int)local_28];
      while (next != (DdNode *)0x0) {
        pDVar2 = next->next;
        saveHandler._0_4_ = (int)*(undefined8 *)&next->type;
        saveHandler._4_4_ = (int)((ulong)*(undefined8 *)&next->type >> 0x20);
        uVar5 = (uint)(((int)saveHandler * 0xc00005 + saveHandler._4_4_) * 0x40f1f9) >>
                ((byte)iVar4 & 0x1f);
        next->next = ppDVar6[(int)uVar5];
        ppDVar6[(int)uVar5] = next;
        next = pDVar2;
      }
    }
    if (ppDVar1 != (DdNode **)0x0) {
      free(ppDVar1);
    }
  }
  else {
    oldshift = unique->subtables[i].slots;
    ppDVar1 = unique->subtables[i].nodelist;
    shift = oldshift << 1;
    iVar4 = unique->subtables[i].shift + -1;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar6 = (DdNode **)malloc((ulong)(uint)shift << 3);
    if (ppDVar6 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var3;
      fprintf((FILE *)unique->err,"Unable to resize subtable %d for lack of memory\n",(ulong)(uint)i
             );
      cuddGarbageCollect(unique,1);
      if (unique->stash == (char *)0x0) {
        return;
      }
      if (unique->stash != (char *)0x0) {
        free(unique->stash);
        unique->stash = (char *)0x0;
      }
      unique->stash = (char *)0x0;
      cuddSlowTableGrowth(unique);
      return;
    }
    Extra_UtilMMoutOfMemory = p_Var3;
    unique->subtables[i].nodelist = ppDVar6;
    unique->subtables[i].slots = shift;
    unique->subtables[i].shift = iVar4;
    unique->subtables[i].maxKeys = oldshift << 3;
    for (local_28 = 0; local_28 < (uint)oldshift; local_28 = local_28 + 1) {
      oddP = ppDVar6 + (int)(local_28 << 1);
      local_78 = ppDVar6 + (int)(local_28 * 2 + 1);
      next = ppDVar1[(int)local_28];
      while ((DdManager *)next != unique) {
        pDVar2 = next->next;
        if (((((uint)(*(long *)(((ulong)(next->type).kids.T & 0xfffffffffffffffe) + 0x20) << 1) |
              (uint)*(undefined8 *)&next->type & 1) * 0xc00005 +
             ((uint)(*(long *)(((ulong)(next->type).kids.E & 0xfffffffffffffffe) + 0x20) << 1) |
             (uint)*(undefined8 *)((long)&next->type + 8) & 1)) * 0x40f1f9 >> ((byte)iVar4 & 0x1f) &
            1) == 0) {
          *oddP = next;
          oddP = &next->next;
          next = pDVar2;
        }
        else {
          *local_78 = next;
          local_78 = &next->next;
          next = pDVar2;
        }
      }
      *local_78 = &unique->sentinel;
      *oddP = &unique->sentinel;
    }
    if (ppDVar1 != (DdNode **)0x0) {
      free(ppDVar1);
    }
  }
  unique->memused = (ulong)(uint)(shift - oldshift) * 8 + unique->memused;
  unique->slots = (shift - oldshift) + unique->slots;
  ddFixLimits(unique);
  return;
}

Assistant:

void
cuddRehash(
  DdManager * unique,
  int i)
{
    unsigned int slots, oldslots;
    int shift, oldshift;
    int j, pos;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    DdNode *sentinel = &(unique->sentinel);
    hack split;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->gcFrac == DD_GC_FRAC_HI && unique->slots > unique->looseUpTo) {
        unique->gcFrac = DD_GC_FRAC_LO;
        unique->minDead = (unsigned) (DD_GC_FRAC_LO * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_LO);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
    }

    if (unique->gcFrac != DD_GC_FRAC_MIN && unique->memused > unique->maxmem) {
        unique->gcFrac = DD_GC_FRAC_MIN;
        unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_MIN);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        cuddShrinkDeathRow(unique);
        if (cuddGarbageCollect(unique,1) > 0) return;
    }

    if (i != CUDD_CONST_INDEX) {
        oldslots = unique->subtables[i].slots;
        oldshift = unique->subtables[i].shift;
        oldnodelist = unique->subtables[i].nodelist;

        /* Compute the new size of the subtable. */
        slots = oldslots << 1;
        shift = oldshift - 1;

        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize subtable %d for lack of memory\n",
                           i);
            /* Prevent frequent resizing attempts. */
            (void) cuddGarbageCollect(unique,1);
            if (unique->stash != NULL) {
                ABC_FREE(unique->stash);
                unique->stash = NULL;
                /* Inhibit resizing of tables. */
                cuddSlowTableGrowth(unique);
            }
            return;
        }
        unique->subtables[i].nodelist = nodelist;
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;

        /* Move the nodes from the old table to the new table.
        ** This code depends on the type of hash function.
        ** It assumes that the effect of doubling the size of the table
        ** is to retain one more bit of the 32-bit hash value.
        ** The additional bit is the LSB. */
        for (j = 0; (unsigned) j < oldslots; j++) {
            DdNodePtr *evenP, *oddP;
            node = oldnodelist[j];
            evenP = &(nodelist[j<<1]);
            oddP = &(nodelist[(j<<1)+1]);
            while (node != sentinel) {
                next = node->next;
                pos = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                if (pos & 1) {
                    *oddP = node;
                    oddP = &(node->next);
                } else {
                    *evenP = node;
                    evenP = &(node->next);
                }
                node = next;
            }
            *evenP = *oddP = sentinel;
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing layer %d: keys %d dead %d new size %d\n",
                       i, unique->subtables[i].keys,
                       unique->subtables[i].dead, slots);
#endif
    } else {
        oldslots = unique->constants.slots;
        oldshift = unique->constants.shift;
        oldnodelist = unique->constants.nodelist;

        /* The constant subtable is never subjected to reordering.
        ** Therefore, when it is resized, it is because it has just
        ** reached the maximum load. We can safely just double the size,
        ** with no need for the loop we use for the other tables.
        */
        slots = oldslots << 1;
        shift = oldshift - 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize constant subtable for lack of memory\n");
            (void) cuddGarbageCollect(unique,1);
            for (j = 0; j < unique->size; j++) {
                unique->subtables[j].maxKeys <<= 1;
            }
            unique->constants.maxKeys <<= 1;
            return;
        }
        unique->constants.slots = slots;
        unique->constants.shift = shift;
        unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->constants.nodelist = nodelist;
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                split.value = cuddV(node);
                pos = ddHash(split.bits[0], split.bits[1], shift);
                node->next = nodelist[pos];
                nodelist[pos] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing constants: keys %d dead %d new size %d\n",
                       unique->constants.keys,unique->constants.dead,slots);
#endif
    }

    /* Update global data */

    unique->memused += (slots - oldslots) * sizeof(DdNodePtr);
    unique->slots += (slots - oldslots);
    ddFixLimits(unique);

}